

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void SetTextureNoErr(side_t *side,int position,DWORD *color,char *name,bool *validcolor,bool isFog)

{
  bool bVar1;
  FTextureID FVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  char name2 [9];
  char local_5d [6];
  byte local_57 [3];
  int local_54;
  DWORD *local_50;
  long local_48;
  size_t local_40;
  byte *local_38;
  
  *validcolor = false;
  FVar2 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  if (-1 < FVar2.texnum) goto LAB_0044941b;
  local_50 = color;
  strncpy(local_5d,name + 1,7);
  local_57[1] = 0;
  if (*name != '#') {
    uVar6 = strtoul(name,(char **)&local_38,0x10);
    *local_50 = (DWORD)uVar6;
    *validcolor = (local_38 <= name + 6 && name + 2 <= local_38) && *local_38 == 0;
    return;
  }
  local_40 = strlen(name);
  *validcolor = false;
  if (6 < (int)local_40) {
    lVar9 = 0;
    do {
      iVar3 = isxdigit((int)local_5d[lVar9]);
      if (iVar3 == 0) {
        local_5d[lVar9] = '0';
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
    local_38 = local_57;
    uVar8 = 0;
    local_54 = 0;
    if ((int)local_40 != 7) {
      uVar7 = 0x5a;
      if ((local_57[0] & 0xffffffdf) < 0x5a) {
        uVar7 = local_57[0] & 0xffffffdf;
      }
      uVar4 = 0x41;
      if (0x41 < uVar7) {
        uVar4 = uVar7;
      }
      local_54 = uVar4 - 0x41;
    }
    local_57[0] = 0;
    local_48 = strtol(local_5d + 4,(char **)0x0,0x10);
    local_5d[4] = 0;
    lVar9 = strtol(local_5d + 2,(char **)0x0,0x10);
    local_5d[2] = 0;
    lVar5 = strtol(local_5d,(char **)0x0,0x10);
    if (isFog) {
LAB_0044955b:
      *local_50 = (int)lVar9 << 8 | (uint)local_48 | (int)lVar5 << 0x10 | uVar8;
      bVar1 = true;
    }
    else {
      if (local_54 != 0) {
        uVar8 = ((uint)((ulong)(uint)(local_54 * 0xff) * 0x51eb851f >> 0x20) & 0xfffffff8) << 0x15;
        goto LAB_0044955b;
      }
      bVar1 = false;
    }
    *validcolor = bVar1;
    if (6 < (int)local_40) {
      return;
    }
  }
  FVar2.texnum = 0;
LAB_0044941b:
  side->textures[position].texture.texnum = FVar2.texnum;
  return;
}

Assistant:

static void SetTextureNoErr (side_t *side, int position, DWORD *color, const char *name, bool *validcolor, bool isFog)
{
	FTextureID texture;
	*validcolor = false;
	texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,	
		FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
	if (!texture.Exists())
	{
		char name2[9];
		char *stop;
		strncpy (name2, name+1, 7);
		name2[7] = 0;
		if (*name != '#')
		{
			*color = strtoul (name, &stop, 16);
			texture = FNullTextureID();
			*validcolor = (*stop == 0) && (stop >= name + 2) && (stop <= name + 6);
			return;
		}
		else	// Support for Legacy's color format!
		{
			int l=(int)strlen(name);
			texture = FNullTextureID();
			*validcolor = false;
			if (l>=7) 
			{
				for(stop=name2;stop<name2+6;stop++) if (!isxdigit(*stop)) *stop='0';

				int factor = l==7? 0 : clamp<int> ((name2[6]&223)-'A', 0, 25);

				name2[6]=0; int blue=strtol(name2+4,NULL,16);
				name2[4]=0; int green=strtol(name2+2,NULL,16);
				name2[2]=0; int red=strtol(name2,NULL,16);

				if (!isFog) 
				{
					if (factor==0) 
					{
						*validcolor=false;
						return;
					}
					factor = factor * 255 / 25;
				}
				else
				{
					factor=0;
				}

				*color=MAKEARGB(factor, red, green, blue);
				texture = FNullTextureID();
				*validcolor = true;
				return;
			}
		}
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}